

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O2

string * utilSolutionStatusToString_abi_cxx11_
                   (string *__return_storage_ptr__,HighsInt solution_status)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (solution_status == 2) {
    pcVar2 = "Feasible";
    paVar1 = &local_b;
  }
  else if (solution_status == 1) {
    pcVar2 = "Infeasible";
    paVar1 = &local_a;
  }
  else if (solution_status == 0) {
    pcVar2 = "None";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "Unrecognised solution status";
    paVar1 = &local_c;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string utilSolutionStatusToString(const HighsInt solution_status) {
  switch (solution_status) {
    case kSolutionStatusNone:
      return "None";
      break;
    case kSolutionStatusInfeasible:
      return "Infeasible";
      break;
    case kSolutionStatusFeasible:
      return "Feasible";
      break;
    default:
      assert(1 == 0);
      return "Unrecognised solution status";
  }
}